

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

Expr * __thiscall SQCompilation::SQParser::BitwiseOrExp(SQParser *this)

{
  Expr *pEVar1;
  NestingChecker nc;
  
  NestingChecker::NestingChecker(&nc,this);
  pEVar1 = BitwiseXorExp(this);
  NestingChecker::inc(&nc);
  if (this->_token == 0x7c) {
    pEVar1 = BIN_EXP<SQCompilation::Expr*(SQCompilation::SQParser::*)()>
                       (this,0x1547de,TO_BLOCK,(Expr *)0x17);
  }
  (nc._p)->_depth = (nc._p)->_depth - nc._depth;
  return pEVar1;
}

Assistant:

Expr* SQParser::BitwiseOrExp()
{
    NestingChecker nc(this);
    Expr *lhs = BitwiseXorExp();
    for (;;) {
        nc.inc();
        if (_token == _SC('|')) {
            return BIN_EXP(&SQParser::BitwiseOrExp, TO_OR, lhs);
        }
        else return lhs;
    }
}